

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isLinearCompareResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord
               ,int coordZ,float cmpReference,float result)

{
  CompareMode compareMode;
  bool isFixedPointDepth_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  int i_00;
  int j_00;
  int j_01;
  TextureFormat *format;
  float fVar8;
  float fVar9;
  float fVar10;
  float y_;
  float z_;
  float w_;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  undefined1 local_a0 [8];
  Vec4 depths;
  float maxB;
  float minB;
  float maxA;
  float minA;
  int y1;
  int y0;
  int x1;
  int x0;
  int i;
  int j;
  int h;
  int w;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  bool isFixedPointDepth;
  float result_local;
  float cmpReference_local;
  int coordZ_local;
  Vec2 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  format = ConstPixelBufferAccess::getFormat(level);
  isFixedPointDepth_00 = isFixedPointDepthTextureFormat(format);
  bVar1 = sampler->normalizedCoords;
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  fVar8 = Vector<float,_2>::x(coord);
  iVar3 = Vector<int,_3>::x(&prec->coordBits);
  iVar4 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar1 & 1),iVar2,fVar8,iVar3,iVar4);
  bVar1 = sampler->normalizedCoords;
  iVar2 = ConstPixelBufferAccess::getHeight(level);
  fVar8 = Vector<float,_2>::y(coord);
  iVar3 = Vector<int,_3>::y(&prec->coordBits);
  iVar4 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar2,fVar8,iVar3,iVar4);
  fVar8 = Vector<float,_2>::x(&vBounds);
  dVar5 = deFloorFloatToInt32(fVar8 - 0.5);
  fVar8 = Vector<float,_2>::y(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar8 - 0.5);
  fVar8 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  x0 = deFloorFloatToInt32(fVar8 - 0.5);
  fVar8 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar7 = deFloorFloatToInt32(fVar8 - 0.5);
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  do {
    x1 = dVar5;
    if (dVar7 < x0) {
      return false;
    }
    for (; x1 <= dVar6; x1 = x1 + 1) {
      iVar4 = TexVerifierUtil::wrap(sampler->wrapS,x1,iVar2);
      i_00 = TexVerifierUtil::wrap(sampler->wrapS,x1 + 1,iVar2);
      j_00 = TexVerifierUtil::wrap(sampler->wrapT,x0,iVar3);
      j_01 = TexVerifierUtil::wrap(sampler->wrapT,x0 + 1,iVar3);
      fVar8 = Vector<float,_2>::x(&vBounds);
      fVar8 = de::clamp<float>((fVar8 - 0.5) - (float)x1,0.0,1.0);
      fVar9 = Vector<float,_2>::y(&vBounds);
      fVar9 = de::clamp<float>((fVar9 - 0.5) - (float)x1,0.0,1.0);
      fVar10 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
      depths.m_data[3] = de::clamp<float>((fVar10 - 0.5) - (float)x0,0.0,1.0);
      fVar10 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
      depths.m_data[2] = de::clamp<float>((fVar10 - 0.5) - (float)x0,0.0,1.0);
      fVar10 = lookupDepth(level,sampler,iVar4,j_00,coordZ);
      y_ = lookupDepth(level,sampler,i_00,j_00,coordZ);
      z_ = lookupDepth(level,sampler,iVar4,j_01,coordZ);
      w_ = lookupDepth(level,sampler,i_00,j_01,coordZ);
      Vector<float,_4>::Vector((Vector<float,_4> *)local_a0,fVar10,y_,z_,w_);
      compareMode = sampler->compare;
      Vector<float,_2>::Vector(&local_a8,fVar8,fVar9);
      Vector<float,_2>::Vector(&local_b0,depths.m_data[3],depths.m_data[2]);
      bVar1 = isBilinearCompareValid
                        (compareMode,prec,(Vec4 *)local_a0,&local_a8,&local_b0,cmpReference,result,
                         isFixedPointDepth_00);
      if (bVar1) {
        return true;
      }
    }
    x0 = x0 + 1;
  } while( true );
}

Assistant:

static bool isLinearCompareResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const TexComparePrecision&			prec,
										const Vec2&							coord,
										const int							coordZ,
										const float							cmpReference,
										const float							result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			const Vec4	depths	(lookupDepth(level, sampler, x0, y0, coordZ),
								 lookupDepth(level, sampler, x1, y0, coordZ),
								 lookupDepth(level, sampler, x0, y1, coordZ),
								 lookupDepth(level, sampler, x1, y1, coordZ));

			if (isBilinearCompareValid(sampler.compare, prec, depths, Vec2(minA, maxA), Vec2(minB, maxB), cmpReference, result, isFixedPointDepth))
				return true;
		}
	}

	return false;
}